

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::Interpreter::Init
          (Error *__return_storage_ptr__,Interpreter *this,string *aConfigFile,string *aRegistryFile
          )

{
  int *__pipedes;
  char cVar1;
  ErrorCode EVar2;
  Status SVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  Error *pEVar9;
  JobManager *this_00;
  Registry *pRVar10;
  char *pcVar11;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  undefined1 local_1f8 [8];
  string sStack_1f0;
  parse_func local_1d0 [1];
  writer write;
  string local_1b8;
  string verboseEnv;
  string configJson;
  undefined1 local_158 [40];
  Config config;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pcVar8 = getenv("VERBOSE");
  pcVar11 = anon_var_dwarf_4dd013 + 9;
  if (pcVar8 != (char *)0x0) {
    pcVar11 = pcVar8;
  }
  std::__cxx11::string::string((string *)&config,pcVar11,(allocator *)local_1f8);
  utils::ToLower(&verboseEnv,(string *)&config);
  std::__cxx11::string::~string((string *)&config);
  configJson._M_dataplus._M_p = (pointer)&configJson.field_2;
  configJson._M_string_length = 0;
  configJson.field_2._M_local_buf[0] = '\0';
  Config::Config(&config);
  if (aConfigFile->_M_string_length == 0) {
    config.mEnableCcm = false;
    local_1f8[0] = 0xff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
              (&config.mPSKc,0x10,local_1f8);
    SysLogger::Create((SysLogger *)local_1f8,kDebug);
    std::__shared_ptr<ot::commissioner::Logger,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ot::commissioner::Logger,(__gnu_cxx::_Lock_policy)2> *)&config.mLogger,
               (__shared_ptr<ot::commissioner::SysLogger,_(__gnu_cxx::_Lock_policy)2> *)local_1f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
  }
  else {
    ReadFile((Error *)local_1f8,&configJson,aConfigFile);
    pEVar9 = Error::operator=(__return_storage_ptr__,(Error *)local_1f8);
    EVar2 = pEVar9->mCode;
    std::__cxx11::string::~string((string *)(local_1f8 + 8));
    if (EVar2 != kNone) goto LAB_001258b4;
    ConfigFromJson((Error *)local_1f8,&config,&configJson);
    pEVar9 = Error::operator=(__return_storage_ptr__,(Error *)local_1f8);
    EVar2 = pEVar9->mCode;
    std::__cxx11::string::~string((string *)(local_1f8 + 8));
    if (EVar2 != kNone) goto LAB_001258b4;
  }
  LOCK();
  (this->mCancelCommand)._M_base._M_i = false;
  UNLOCK();
  this_00 = (JobManager *)operator_new(0x180);
  JobManager::JobManager(this_00,this);
  std::__shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>::
  reset<ot::commissioner::JobManager>
            (&(this->mJobManager).
              super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>,this_00);
  JobManager::Init((Error *)local_1f8,
                   (this->mJobManager).
                   super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&config);
  pEVar9 = Error::operator=(__return_storage_ptr__,(Error *)local_1f8);
  EVar2 = pEVar9->mCode;
  std::__cxx11::string::~string((string *)(local_1f8 + 8));
  if (EVar2 != kNone) goto LAB_001258b4;
  pRVar10 = (Registry *)operator_new(0x10);
  persistent_storage::Registry::Registry(pRVar10,aRegistryFile);
  std::__shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>::
  reset<ot::commissioner::persistent_storage::Registry>
            (&(this->mRegistry).
              super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
             ,pRVar10);
  pRVar10 = (this->mRegistry).
            super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (pRVar10 == (Registry *)0x0) {
    local_1f8._0_4_ = kAlreadyExists;
    sStack_1f0._M_dataplus._M_p = "Failed to create registry for file \'{}\'";
    sStack_1f0._M_string_length = 0x27;
    sStack_1f0.field_2._M_allocated_capacity = 0x100000000;
    local_1d0[0] = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar11 = "Failed to create registry for file \'{}\'";
    sStack_1f0.field_2._8_8_ = local_1f8;
    write.handler_ = (format_string_checker<char> *)local_1f8;
    while (pcVar11 != "") {
      cVar1 = *pcVar11;
      pcVar8 = pcVar11;
      while (cVar1 != '{') {
        pcVar8 = pcVar8 + 1;
        if (pcVar8 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,pcVar11,"");
          goto LAB_00125853;
        }
        cVar1 = *pcVar8;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&write,pcVar11,pcVar8);
      pcVar11 = ::fmt::v10::detail::
                parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                          (pcVar8,"",(format_string_checker<char> *)local_1f8);
    }
LAB_00125853:
    local_1f8 = (undefined1  [8])(aRegistryFile->_M_dataplus)._M_p;
    sStack_1f0._M_dataplus._M_p = (pointer)aRegistryFile->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x27;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_1f8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1b8,(v10 *)"Failed to create registry for file \'{}\'",fmt,args_00);
    local_158._0_4_ = kOutOfMemory;
    std::__cxx11::string::string((string *)(local_158 + 8),(string *)&local_1b8);
LAB_00125892:
    Error::operator=(__return_storage_ptr__,(Error *)local_158);
    std::__cxx11::string::~string((string *)(local_158 + 8));
    this_01 = &local_1b8;
  }
  else {
    SVar3 = persistent_storage::Registry::Open(pRVar10);
    if (SVar3 != kSuccess) {
      local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffff00000000);
      sStack_1f0._M_dataplus._M_p = "registry failed to open";
      sStack_1f0._M_string_length = 0x17;
      sStack_1f0.field_2._M_allocated_capacity = 0;
      local_1d0[0] = (parse_func)0x0;
      pcVar11 = "registry failed to open";
      sStack_1f0.field_2._8_8_ = local_1f8;
      while (pcVar8 = pcVar11, pcVar8 != "") {
        pcVar11 = pcVar8 + 1;
        if (*pcVar8 == '}') {
          if ((pcVar11 == "") || (*pcVar11 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar11 = pcVar8 + 2;
        }
        else if (*pcVar8 == '{') {
          pcVar11 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar8,"",(format_string_checker<char> *)local_1f8);
        }
      }
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_1f8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_1b8,(v10 *)"registry failed to open",(string_view)ZEXT816(0x17),args);
      local_158._0_4_ = kRegistryError;
      std::__cxx11::string::string((string *)(local_158 + 8),(string *)&local_1b8);
      goto LAB_00125892;
    }
    __pipedes = this->mCancelPipe;
    iVar6 = pipe(__pipedes);
    if (iVar6 == -1) {
      local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffff00000000);
      sStack_1f0._M_dataplus._M_p = "failed to initialize command cancellation structures";
      sStack_1f0._M_string_length = 0x34;
      sStack_1f0.field_2._M_allocated_capacity = 0;
      local_1d0[0] = (parse_func)0x0;
      pcVar11 = "failed to initialize command cancellation structures";
      sStack_1f0.field_2._8_8_ = local_1f8;
      write.handler_ = (format_string_checker<char> *)local_1f8;
      while (pcVar11 != "") {
        cVar1 = *pcVar11;
        pcVar8 = pcVar11;
        while (cVar1 != '{') {
          pcVar8 = pcVar8 + 1;
          if (pcVar8 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)&write,pcVar11,"");
            goto LAB_00125a50;
          }
          cVar1 = *pcVar8;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)&write,pcVar11,pcVar8);
        pcVar11 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar8,"",(format_string_checker<char> *)local_1f8);
      }
LAB_00125a50:
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_1f8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_1b8,(v10 *)"failed to initialize command cancellation structures",
                 (string_view)ZEXT816(0x34),args_01);
      local_158._0_4_ = kIOError;
      std::__cxx11::string::string((string *)(local_158 + 8),(string *)&local_1b8);
      goto LAB_00125892;
    }
    uVar7 = fcntl(*__pipedes,3,0);
    fcntl(*__pipedes,4,(ulong)(uVar7 | 0x800));
    uVar7 = fcntl(this->mCancelPipe[1],3,0);
    fcntl(this->mCancelPipe[1],4,(ulong)(uVar7 | 0x800));
    bVar4 = std::operator==(&verboseEnv,"1");
    bVar5 = true;
    if ((!bVar4) && (bVar4 = std::operator==(&verboseEnv,"yes"), !bVar4)) {
      bVar5 = std::operator==(&verboseEnv,"true");
    }
    gVerbose = bVar5;
    UpdateNetworkSelectionInfo((Error *)local_1f8,this,true);
    Error::operator=(__return_storage_ptr__,(Error *)local_1f8);
    this_01 = (string *)(local_1f8 + 8);
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_001258b4:
  Config::~Config(&config);
  std::__cxx11::string::~string((string *)&configJson);
  std::__cxx11::string::~string((string *)&verboseEnv);
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::Init(const std::string &aConfigFile, const std::string &aRegistryFile)
{
    Error error;

    std::string verboseEnv = ToLower(SafeStr(getenv("VERBOSE")));
    std::string configJson;
    Config      config;

    if (!aConfigFile.empty())
    {
        SuccessOrExit(error = ReadFile(configJson, aConfigFile));
        SuccessOrExit(error = ConfigFromJson(config, configJson));
    }
    else
    {
        // Default to Non-CCM mode if no configuration file is provided.
        config.mEnableCcm = false;
        config.mPSKc.assign(kMaxPSKcLength, 0xff);
        config.mLogger = SysLogger::Create(LogLevel::kDebug);
    }

    int flags;

    mCancelCommand = false;

    mJobManager.reset(new JobManager(*this));
    SuccessOrExit(error = mJobManager->Init(config));
    mRegistry.reset(new Registry(aRegistryFile));
    VerifyOrExit(mRegistry != nullptr,
                 error = ERROR_OUT_OF_MEMORY("Failed to create registry for file '{}'", aRegistryFile));
    VerifyOrExit(mRegistry->Open() == RegistryStatus::kSuccess,
                 error = ERROR_REGISTRY_ERROR("registry failed to open"));

    VerifyOrExit(pipe(mCancelPipe) != -1,
                 error = ERROR_IO_ERROR("failed to initialize command cancellation structures"));
    // set both pipe FDs non-blocking
    flags = fcntl(mCancelPipe[0], F_GETFL, 0);
    fcntl(mCancelPipe[0], F_SETFL, flags | O_NONBLOCK);
    flags = fcntl(mCancelPipe[1], F_GETFL, 0);
    fcntl(mCancelPipe[1], F_SETFL, flags | O_NONBLOCK);
    // set up console verbosity
    gVerbose = verboseEnv == "1" || verboseEnv == "yes" || verboseEnv == "true";
    error    = UpdateNetworkSelectionInfo(true);
exit:
    return error;
}